

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,location_declaration_t *d)

{
  system_t *psVar1;
  process_id_t pid_00;
  process_declaration_t *this_00;
  string *psVar2;
  attributes_t *attributes;
  attributes_t local_58;
  process_id_t local_1c;
  location_declaration_t *plStack_18;
  process_id_t pid;
  location_declaration_t *d_local;
  system_builder_t *this_local;
  
  psVar1 = this->_system;
  plStack_18 = d;
  d_local = (location_declaration_t *)this;
  this_00 = parsing::location_declaration_t::process(d);
  psVar2 = parsing::process_declaration_t::name_abi_cxx11_(this_00);
  pid_00 = processes_t::process_id(&psVar1->super_processes_t,psVar2);
  psVar1 = this->_system;
  local_1c = pid_00;
  psVar2 = parsing::location_declaration_t::name_abi_cxx11_(plStack_18);
  attributes = parsing::declaration_t::attributes((declaration_t *)plStack_18);
  attributes_t::attributes_t(&local_58,attributes);
  system_t::add_location(psVar1,pid_00,psVar2,&local_58);
  attributes_t::~attributes_t(&local_58);
  return;
}

Assistant:

virtual void visit(tchecker::parsing::location_declaration_t const & d)
  {
    tchecker::process_id_t pid = _system.process_id(d.process().name());
    _system.add_location(pid, d.name(), d.attributes());
  }